

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O3

void init_proc_e600(CPUPPCState_conflict2 *env)

{
  int nb_ways;
  undefined8 uVar1;
  CPUPPCState_conflict3 *__mptr;
  int nb_tlbs;
  undefined8 uVar2;
  
  gen_spr_ne_601(env);
  gen_spr_sdr1(env);
  gen_spr_7xx(env);
  gen_tbl(env);
  gen_spr_74xx(env);
  if ((((env->spr_cb[0x3a7].name == (char *)0x0) && (env->spr[0x3a7] == 0)) &&
      (env->spr_cb[0x3a7].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
     (((env->spr_cb[0x3a7].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
       (env->spr_cb[0x3a7].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
      (env->spr_cb[0x3a7].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
    env->spr_cb[0x3a7].name = "UBAMR";
    env->spr_cb[0x3a7].uea_read = spr_read_ureg;
    env->spr_cb[0x3a7].uea_write = spr_noaccess;
    env->spr_cb[0x3a7].oea_read = spr_read_ureg;
    env->spr_cb[0x3a7].oea_write = spr_noaccess;
    env->spr_cb[0x3a7].hea_read = spr_read_ureg;
    env->spr_cb[0x3a7].hea_write = spr_noaccess;
    env->spr_cb[0x3a7].default_value = 0;
    env->spr[0x3a7] = 0;
    if (((env->spr_cb[0x3f8].name == (char *)0x0) && (env->spr[0x3f8] == 0)) &&
       ((env->spr_cb[0x3f8].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
        (((env->spr_cb[0x3f8].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
          (env->spr_cb[0x3f8].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
         (env->spr_cb[0x3f8].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
      env->spr_cb[0x3f8].name = "LDSTCR";
      env->spr_cb[0x3f8].uea_read = spr_noaccess;
      env->spr_cb[0x3f8].uea_write = spr_noaccess;
      env->spr_cb[0x3f8].oea_read = spr_read_generic;
      nb_tlbs = 0xb5ff50;
      env->spr_cb[0x3f8].oea_write = spr_write_generic;
      env->spr_cb[0x3f8].hea_read = spr_read_generic;
      env->spr_cb[0x3f8].hea_write = spr_write_generic;
      env->spr_cb[0x3f8].default_value = 0;
      env->spr[0x3f8] = 0;
      if (((env->spr_cb[0x3f3].name == (char *)0x0) && (env->spr[0x3f3] == 0)) &&
         (((env->spr_cb[0x3f3].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
           ((env->spr_cb[0x3f3].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
            (env->spr_cb[0x3f3].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
          (env->spr_cb[0x3f3].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
        env->spr_cb[0x3f3].name = "ICTRL";
        env->spr_cb[0x3f3].uea_read = spr_noaccess;
        env->spr_cb[0x3f3].uea_write = spr_noaccess;
        env->spr_cb[0x3f3].oea_read = spr_read_generic;
        env->spr_cb[0x3f3].oea_write = spr_write_generic;
        env->spr_cb[0x3f3].hea_read = spr_read_generic;
        env->spr_cb[0x3f3].hea_write = spr_write_generic;
        env->spr_cb[0x3f3].default_value = 0;
        env->spr[0x3f3] = 0;
        if (((((env->spr_cb[0x3f7].name == (char *)0x0) && (env->spr[0x3f7] == 0)) &&
             (env->spr_cb[0x3f7].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
            ((env->spr_cb[0x3f7].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
             (env->spr_cb[0x3f7].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
           (env->spr_cb[0x3f7].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
          env->spr_cb[0x3f7].name = "MSSSR0";
          env->spr_cb[0x3f7].uea_read = spr_noaccess;
          env->spr_cb[0x3f7].uea_write = spr_noaccess;
          env->spr_cb[0x3f7].oea_read = spr_read_generic;
          env->spr_cb[0x3f7].oea_write = spr_write_generic;
          env->spr_cb[0x3f7].hea_read = spr_read_generic;
          env->spr_cb[0x3f7].hea_write = spr_write_generic;
          env->spr_cb[0x3f7].default_value = 0;
          env->spr[0x3f7] = 0;
          if (((env->spr_cb[0x3b1].name == (char *)0x0) && (env->spr[0x3b1] == 0)) &&
             ((env->spr_cb[0x3b1].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
              (((env->spr_cb[0x3b1].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                (env->spr_cb[0x3b1].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
               (env->spr_cb[0x3b1].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
            env->spr_cb[0x3b1].name = "PMC5";
            env->spr_cb[0x3b1].uea_read = spr_noaccess;
            env->spr_cb[0x3b1].uea_write = spr_noaccess;
            env->spr_cb[0x3b1].oea_read = spr_read_generic;
            env->spr_cb[0x3b1].oea_write = spr_write_generic;
            env->spr_cb[0x3b1].hea_read = spr_read_generic;
            env->spr_cb[0x3b1].hea_write = spr_write_generic;
            env->spr_cb[0x3b1].default_value = 0;
            env->spr[0x3b1] = 0;
            if ((((env->spr_cb[0x3a1].name == (char *)0x0) && (env->spr[0x3a1] == 0)) &&
                ((env->spr_cb[0x3a1].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                 ((env->spr_cb[0x3a1].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                  (env->spr_cb[0x3a1].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0))))))
               && (env->spr_cb[0x3a1].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
              env->spr_cb[0x3a1].name = "UPMC5";
              env->spr_cb[0x3a1].uea_read = spr_read_ureg;
              env->spr_cb[0x3a1].uea_write = spr_noaccess;
              env->spr_cb[0x3a1].oea_read = spr_read_ureg;
              env->spr_cb[0x3a1].oea_write = spr_noaccess;
              env->spr_cb[0x3a1].hea_read = spr_read_ureg;
              env->spr_cb[0x3a1].hea_write = spr_noaccess;
              env->spr_cb[0x3a1].default_value = 0;
              env->spr[0x3a1] = 0;
              if ((((env->spr_cb[0x3b2].name == (char *)0x0) && (env->spr[0x3b2] == 0)) &&
                  (env->spr_cb[0x3b2].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                 (((env->spr_cb[0x3b2].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                   (env->spr_cb[0x3b2].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                  (env->spr_cb[0x3b2].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
                env->spr_cb[0x3b2].name = "PMC6";
                env->spr_cb[0x3b2].uea_read = spr_noaccess;
                env->spr_cb[0x3b2].uea_write = spr_noaccess;
                env->spr_cb[0x3b2].oea_read = spr_read_generic;
                env->spr_cb[0x3b2].oea_write = spr_write_generic;
                env->spr_cb[0x3b2].hea_read = spr_read_generic;
                env->spr_cb[0x3b2].hea_write = spr_write_generic;
                env->spr_cb[0x3b2].default_value = 0;
                env->spr[0x3b2] = 0;
                if (((env->spr_cb[0x3a2].name == (char *)0x0) && (env->spr[0x3a2] == 0)) &&
                   ((env->spr_cb[0x3a2].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                    (((env->spr_cb[0x3a2].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                      (env->spr_cb[0x3a2].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0))
                     && (env->spr_cb[0x3a2].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)
                     ))))) {
                  env->spr_cb[0x3a2].name = "UPMC6";
                  env->spr_cb[0x3a2].uea_read = spr_read_ureg;
                  env->spr_cb[0x3a2].uea_write = spr_noaccess;
                  env->spr_cb[0x3a2].oea_read = spr_read_ureg;
                  env->spr_cb[0x3a2].oea_write = spr_noaccess;
                  env->spr_cb[0x3a2].hea_read = spr_read_ureg;
                  env->spr_cb[0x3a2].hea_write = spr_noaccess;
                  env->spr_cb[0x3a2].default_value = 0;
                  env->spr[0x3a2] = 0;
                  if (((env->spr_cb[0x114].name == (char *)0x0) && (env->spr[0x114] == 0)) &&
                     (((env->spr_cb[0x114].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                       ((env->spr_cb[0x114].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0
                        && (env->spr_cb[0x114].uea_read ==
                            (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
                      (env->spr_cb[0x114].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))
                     ) {
                    env->spr_cb[0x114].name = "SPRG4";
                    env->spr_cb[0x114].uea_read = spr_noaccess;
                    env->spr_cb[0x114].uea_write = spr_noaccess;
                    env->spr_cb[0x114].oea_read = spr_read_generic;
                    env->spr_cb[0x114].oea_write = spr_write_generic;
                    env->spr_cb[0x114].hea_read = spr_read_generic;
                    env->spr_cb[0x114].hea_write = spr_write_generic;
                    env->spr_cb[0x114].default_value = 0;
                    env->spr[0x114] = 0;
                    if (((((env->spr_cb[0x104].name == (char *)0x0) && (env->spr[0x104] == 0)) &&
                         (env->spr_cb[0x104].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)
                         ) && ((env->spr_cb[0x104].oea_write ==
                                (_func_void_DisasContext_ptr_int_int *)0x0 &&
                               (env->spr_cb[0x104].uea_read ==
                                (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
                       (env->spr_cb[0x104].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0))
                    {
                      env->spr_cb[0x104].name = "USPRG4";
                      env->spr_cb[0x104].uea_read = spr_read_ureg;
                      env->spr_cb[0x104].uea_write = spr_noaccess;
                      env->spr_cb[0x104].oea_read = spr_read_ureg;
                      env->spr_cb[0x104].oea_write = spr_noaccess;
                      env->spr_cb[0x104].hea_read = spr_read_ureg;
                      env->spr_cb[0x104].hea_write = spr_noaccess;
                      env->spr_cb[0x104].default_value = 0;
                      env->spr[0x104] = 0;
                      if (((env->spr_cb[0x115].name == (char *)0x0) && (env->spr[0x115] == 0)) &&
                         ((env->spr_cb[0x115].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0
                          && (((env->spr_cb[0x115].oea_write ==
                                (_func_void_DisasContext_ptr_int_int *)0x0 &&
                               (env->spr_cb[0x115].uea_read ==
                                (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                              (env->spr_cb[0x115].uea_write ==
                               (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
                        env->spr_cb[0x115].name = "SPRG5";
                        env->spr_cb[0x115].uea_read = spr_noaccess;
                        env->spr_cb[0x115].uea_write = spr_noaccess;
                        env->spr_cb[0x115].oea_read = spr_read_generic;
                        env->spr_cb[0x115].oea_write = spr_write_generic;
                        env->spr_cb[0x115].hea_read = spr_read_generic;
                        env->spr_cb[0x115].hea_write = spr_write_generic;
                        env->spr_cb[0x115].default_value = 0;
                        env->spr[0x115] = 0;
                        if (((env->spr_cb[0x105].name == (char *)0x0) && (env->spr[0x105] == 0)) &&
                           (((env->spr_cb[0x105].oea_read ==
                              (_func_void_DisasContext_ptr_int_int *)0x0 &&
                             ((env->spr_cb[0x105].oea_write ==
                               (_func_void_DisasContext_ptr_int_int *)0x0 &&
                              (env->spr_cb[0x105].uea_read ==
                               (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
                            (env->spr_cb[0x105].uea_write ==
                             (_func_void_DisasContext_ptr_int_int *)0x0)))) {
                          env->spr_cb[0x105].name = "USPRG5";
                          env->spr_cb[0x105].uea_read = spr_read_ureg;
                          env->spr_cb[0x105].uea_write = spr_noaccess;
                          env->spr_cb[0x105].oea_read = spr_read_ureg;
                          env->spr_cb[0x105].oea_write = spr_noaccess;
                          env->spr_cb[0x105].hea_read = spr_read_ureg;
                          env->spr_cb[0x105].hea_write = spr_noaccess;
                          env->spr_cb[0x105].default_value = 0;
                          env->spr[0x105] = 0;
                          if ((((env->spr_cb[0x116].name == (char *)0x0) && (env->spr[0x116] == 0))
                              && (env->spr_cb[0x116].oea_read ==
                                  (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                             (((env->spr_cb[0x116].oea_write ==
                                (_func_void_DisasContext_ptr_int_int *)0x0 &&
                               (env->spr_cb[0x116].uea_read ==
                                (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                              (env->spr_cb[0x116].uea_write ==
                               (_func_void_DisasContext_ptr_int_int *)0x0)))) {
                            env->spr_cb[0x116].name = "SPRG6";
                            env->spr_cb[0x116].uea_read = spr_noaccess;
                            env->spr_cb[0x116].uea_write = spr_noaccess;
                            env->spr_cb[0x116].oea_read = spr_read_generic;
                            env->spr_cb[0x116].oea_write = spr_write_generic;
                            env->spr_cb[0x116].hea_read = spr_read_generic;
                            env->spr_cb[0x116].hea_write = spr_write_generic;
                            env->spr_cb[0x116].default_value = 0;
                            env->spr[0x116] = 0;
                            if (((env->spr_cb[0x106].name == (char *)0x0) && (env->spr[0x106] == 0))
                               && ((env->spr_cb[0x106].oea_read ==
                                    (_func_void_DisasContext_ptr_int_int *)0x0 &&
                                   (((env->spr_cb[0x106].oea_write ==
                                      (_func_void_DisasContext_ptr_int_int *)0x0 &&
                                     (env->spr_cb[0x106].uea_read ==
                                      (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                                    (env->spr_cb[0x106].uea_write ==
                                     (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
                              env->spr_cb[0x106].name = "USPRG6";
                              env->spr_cb[0x106].uea_read = spr_read_ureg;
                              env->spr_cb[0x106].uea_write = spr_noaccess;
                              env->spr_cb[0x106].oea_read = spr_read_ureg;
                              env->spr_cb[0x106].oea_write = spr_noaccess;
                              env->spr_cb[0x106].hea_read = spr_read_ureg;
                              env->spr_cb[0x106].hea_write = spr_noaccess;
                              env->spr_cb[0x106].default_value = 0;
                              env->spr[0x106] = 0;
                              if (((env->spr_cb[0x117].name == (char *)0x0) &&
                                  (env->spr[0x117] == 0)) &&
                                 (((env->spr_cb[0x117].oea_read ==
                                    (_func_void_DisasContext_ptr_int_int *)0x0 &&
                                   ((env->spr_cb[0x117].oea_write ==
                                     (_func_void_DisasContext_ptr_int_int *)0x0 &&
                                    (env->spr_cb[0x117].uea_read ==
                                     (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
                                  (env->spr_cb[0x117].uea_write ==
                                   (_func_void_DisasContext_ptr_int_int *)0x0)))) {
                                env->spr_cb[0x117].name = "SPRG7";
                                env->spr_cb[0x117].uea_read = spr_noaccess;
                                env->spr_cb[0x117].uea_write = spr_noaccess;
                                env->spr_cb[0x117].oea_read = spr_read_generic;
                                env->spr_cb[0x117].oea_write = spr_write_generic;
                                env->spr_cb[0x117].hea_read = spr_read_generic;
                                env->spr_cb[0x117].hea_write = spr_write_generic;
                                env->spr_cb[0x117].default_value = 0;
                                env->spr[0x117] = 0;
                                if (((((env->spr_cb[0x107].name == (char *)0x0) &&
                                      (env->spr[0x107] == 0)) &&
                                     (env->spr_cb[0x107].oea_read ==
                                      (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                                    ((env->spr_cb[0x107].oea_write ==
                                      (_func_void_DisasContext_ptr_int_int *)0x0 &&
                                     (env->spr_cb[0x107].uea_read ==
                                      (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
                                   (env->spr_cb[0x107].uea_write ==
                                    (_func_void_DisasContext_ptr_int_int *)0x0)) {
                                  env->spr_cb[0x107].name = "USPRG7";
                                  env->spr_cb[0x107].uea_read = spr_read_ureg;
                                  env->spr_cb[0x107].uea_write = spr_noaccess;
                                  env->spr_cb[0x107].oea_read = spr_read_ureg;
                                  env->spr_cb[0x107].oea_write = spr_noaccess;
                                  env->spr_cb[0x107].hea_read = spr_read_ureg;
                                  env->spr_cb[0x107].hea_write = spr_noaccess;
                                  env->spr_cb[0x107].default_value = 0;
                                  env->spr[0x107] = 0;
                                  gen_low_BATs(env);
                                  gen_high_BATs(env);
                                  gen_74xx_soft_tlb(env,nb_tlbs,nb_ways);
                                  env->excp_vectors[0x40] = 0x100;
                                  env->excp_vectors[1] = 0x200;
                                  env->excp_vectors[2] = 0x300;
                                  env->excp_vectors[3] = 0x400;
                                  env->excp_vectors[4] = 0x500;
                                  env->excp_vectors[5] = 0x600;
                                  env->excp_vectors[6] = 0x700;
                                  env->excp_vectors[7] = 0x800;
                                  env->excp_vectors[10] = 0x900;
                                  env->excp_vectors[8] = 0xc00;
                                  env->excp_vectors[0x44] = 0xd00;
                                  env->excp_vectors[0x55] = 0xf00;
                                  env->excp_vectors[0x49] = 0xf20;
                                  env->excp_vectors[0x4e] = 0x1000;
                                  env->excp_vectors[0x4f] = 0x1100;
                                  env->excp_vectors[0x50] = 0x1200;
                                  env->excp_vectors[0x53] = 0x1300;
                                  env->excp_vectors[0x54] = 0x1400;
                                  env->excp_vectors[0x57] = 0x1600;
                                  env->hreset_vector = 0x100;
                                  env->dcache_line_size = 0x20;
                                  env->icache_line_size = 0x20;
                                  ppc6xx_irq_init_ppc64
                                            ((PowerPCCPU_conflict3 *)
                                             &env[-1].spr_cb[0x1bf].oea_write);
                                  return;
                                }
                                uVar2 = 0x107;
                                uVar1 = 0x107;
                              }
                              else {
                                uVar2 = 0x117;
                                uVar1 = 0x117;
                              }
                            }
                            else {
                              uVar2 = 0x106;
                              uVar1 = 0x106;
                            }
                          }
                          else {
                            uVar2 = 0x116;
                            uVar1 = 0x116;
                          }
                        }
                        else {
                          uVar2 = 0x105;
                          uVar1 = 0x105;
                        }
                      }
                      else {
                        uVar2 = 0x115;
                        uVar1 = 0x115;
                      }
                    }
                    else {
                      uVar2 = 0x104;
                      uVar1 = 0x104;
                    }
                  }
                  else {
                    uVar2 = 0x114;
                    uVar1 = 0x114;
                  }
                }
                else {
                  uVar2 = 0x3a2;
                  uVar1 = 0x3a2;
                }
              }
              else {
                uVar2 = 0x3b2;
                uVar1 = 0x3b2;
              }
            }
            else {
              uVar2 = 0x3a1;
              uVar1 = 0x3a1;
            }
          }
          else {
            uVar2 = 0x3b1;
            uVar1 = 0x3b1;
          }
        }
        else {
          uVar2 = 0x3f7;
          uVar1 = 0x3f7;
        }
      }
      else {
        uVar2 = 0x3f3;
        uVar1 = 0x3f3;
      }
    }
    else {
      uVar2 = 0x3f8;
      uVar1 = 0x3f8;
    }
  }
  else {
    uVar2 = 0x3a7;
    uVar1 = 0x3a7;
  }
  printf("Error: Trying to register SPR %d (%03x) twice !\n",uVar2,uVar1);
  exit(1);
}

Assistant:

static void init_proc_e600(CPUPPCState *env)
{
    gen_spr_ne_601(env);
    gen_spr_sdr1(env);
    gen_spr_7xx(env);
    /* Time base */
    gen_tbl(env);
    /* 74xx specific SPR */
    gen_spr_74xx(env);
    /* XXX : not implemented */
    spr_register(env, SPR_UBAMR, "UBAMR",
                 &spr_read_ureg, SPR_NOACCESS,
                 &spr_read_ureg, SPR_NOACCESS,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_LDSTCR, "LDSTCR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_ICTRL, "ICTRL",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_MSSSR0, "MSSSR0",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_7XX_PMC5, "PMC5",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_7XX_UPMC5, "UPMC5",
                 &spr_read_ureg, SPR_NOACCESS,
                 &spr_read_ureg, SPR_NOACCESS,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_7XX_PMC6, "PMC6",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_7XX_UPMC6, "UPMC6",
                 &spr_read_ureg, SPR_NOACCESS,
                 &spr_read_ureg, SPR_NOACCESS,
                 0x00000000);
    /* SPRGs */
    spr_register(env, SPR_SPRG4, "SPRG4",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    spr_register(env, SPR_USPRG4, "USPRG4",
                 &spr_read_ureg, SPR_NOACCESS,
                 &spr_read_ureg, SPR_NOACCESS,
                 0x00000000);
    spr_register(env, SPR_SPRG5, "SPRG5",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    spr_register(env, SPR_USPRG5, "USPRG5",
                 &spr_read_ureg, SPR_NOACCESS,
                 &spr_read_ureg, SPR_NOACCESS,
                 0x00000000);
    spr_register(env, SPR_SPRG6, "SPRG6",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    spr_register(env, SPR_USPRG6, "USPRG6",
                 &spr_read_ureg, SPR_NOACCESS,
                 &spr_read_ureg, SPR_NOACCESS,
                 0x00000000);
    spr_register(env, SPR_SPRG7, "SPRG7",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    spr_register(env, SPR_USPRG7, "USPRG7",
                 &spr_read_ureg, SPR_NOACCESS,
                 &spr_read_ureg, SPR_NOACCESS,
                 0x00000000);
    /* Memory management */
    gen_low_BATs(env);
    gen_high_BATs(env);
    gen_74xx_soft_tlb(env, 128, 2);
    init_excp_7450(env);
    env->dcache_line_size = 32;
    env->icache_line_size = 32;
    /* Allocate hardware IRQ controller */
    ppc6xx_irq_init(env_archcpu(env));
}